

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::PushColumnClipRect(int column_index)

{
  ImGuiColumnsSet *pIVar1;
  ImGuiColumnData *pIVar2;
  
  pIVar1 = (GImGui->CurrentWindow->DC).ColumnsSet;
  if (column_index < 0) {
    column_index = pIVar1->Current;
  }
  if (column_index < (pIVar1->Columns).Size) {
    pIVar2 = (pIVar1->Columns).Data;
    PushClipRect(&pIVar2[column_index].ClipRect.Min,&pIVar2[column_index].ClipRect.Max,false);
    return;
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4c0,
                "value_type &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }